

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ReduceL1LayerParams::InternalSwap
          (ReduceL1LayerParams *this,ReduceL1LayerParams *other)

{
  bool bVar1;
  int iVar2;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  bVar1 = this->keepdims_;
  this->keepdims_ = other->keepdims_;
  other->keepdims_ = bVar1;
  bVar1 = this->reduceall_;
  this->reduceall_ = other->reduceall_;
  other->reduceall_ = bVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void ReduceL1LayerParams::InternalSwap(ReduceL1LayerParams* other) {
  axes_.InternalSwap(&other->axes_);
  std::swap(keepdims_, other->keepdims_);
  std::swap(reduceall_, other->reduceall_);
  std::swap(_cached_size_, other->_cached_size_);
}